

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void gc_free_cycles(JSRuntime *rt)

{
  list_head *el_00;
  long in_RDI;
  JSGCObjectHeader *p;
  list_head *el1;
  list_head *el;
  JSGCObjectHeader *in_stack_ffffffffffffffd8;
  list_head *rt_00;
  long local_18;
  long local_10;
  
  *(undefined1 *)(in_RDI + 0xb8) = 2;
  while (el_00 = *(list_head **)(in_RDI + 0xb0), el_00 != (list_head *)(in_RDI + 0xa8)) {
    rt_00 = (list_head *)&el_00[-1].next;
    if ((*(byte *)((long)&el_00[-1].next + 4) & 0xf) < 2) {
      free_gc_object((JSRuntime *)rt_00,in_stack_ffffffffffffffd8);
    }
    else {
      list_del(el_00);
      list_add_tail(rt_00,(list_head *)in_stack_ffffffffffffffd8);
    }
  }
  *(undefined1 *)(in_RDI + 0xb8) = 0;
  local_10 = *(long *)(in_RDI + 0xa0);
  local_18 = *(long *)(local_10 + 8);
  while (local_10 != in_RDI + 0x98) {
    js_free_rt((JSRuntime *)(local_10 + -8),in_stack_ffffffffffffffd8);
    local_10 = local_18;
    local_18 = *(long *)(local_18 + 8);
  }
  init_list_head((list_head *)(in_RDI + 0x98));
  return;
}

Assistant:

static void gc_free_cycles(JSRuntime *rt)
{
    struct list_head *el, *el1;
    JSGCObjectHeader *p;
#ifdef DUMP_GC_FREE
    BOOL header_done = FALSE;
#endif

    rt->gc_phase = JS_GC_PHASE_REMOVE_CYCLES;

    for(;;) {
        el = rt->tmp_obj_list.next;
        if (el == &rt->tmp_obj_list)
            break;
        p = list_entry(el, JSGCObjectHeader, link);
        /* Only need to free the GC object associated with JS
           values. The rest will be automatically removed because they
           must be referenced by them. */
        switch(p->gc_obj_type) {
        case JS_GC_OBJ_TYPE_JS_OBJECT:
        case JS_GC_OBJ_TYPE_FUNCTION_BYTECODE:
#ifdef DUMP_GC_FREE
            if (!header_done) {
                printf("Freeing cycles:\n");
                JS_DumpObjectHeader(rt);
                header_done = TRUE;
            }
            JS_DumpGCObject(rt, p);
#endif
            free_gc_object(rt, p);
            break;
        default:
            list_del(&p->link);
            list_add_tail(&p->link, &rt->gc_zero_ref_count_list);
            break;
        }
    }
    rt->gc_phase = JS_GC_PHASE_NONE;
           
    list_for_each_safe(el, el1, &rt->gc_zero_ref_count_list) {
        p = list_entry(el, JSGCObjectHeader, link);
        assert(p->gc_obj_type == JS_GC_OBJ_TYPE_JS_OBJECT ||
               p->gc_obj_type == JS_GC_OBJ_TYPE_FUNCTION_BYTECODE);
        js_free_rt(rt, p);
    }

    init_list_head(&rt->gc_zero_ref_count_list);
}